

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O1

Data2D<int> *
TasGrid::HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)1>
          (Data2D<int> *__return_storage_ptr__,MultiIndexSet *mset,bool *is_complete)

{
  int *piVar1;
  size_type __n;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  size_t sVar6;
  unsigned_long __n2;
  pointer __src;
  size_t sVar7;
  long lVar8;
  vector<int,_std::allocator<int>_> dad;
  allocator_type local_79;
  Data2D<int> *local_78;
  vector<int,_std::allocator<int>_> local_70;
  vector<int,_std::allocator<int>_> *local_58;
  bool *local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  __n = mset->num_dimensions;
  sVar7 = (size_t)mset->cache_num_indexes;
  __return_storage_ptr__->stride = (long)(int)__n;
  __return_storage_ptr__->num_strips = sVar7;
  local_78 = __return_storage_ptr__;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->vec,(long)(int)__n * sVar7,(allocator_type *)&local_70);
  local_50 = is_complete;
  if ((long)sVar7 < 1) {
    bVar3 = true;
  }
  else {
    local_48 = __n * 4;
    sVar6 = 0;
    bVar3 = false;
    local_58 = &__return_storage_ptr__->vec;
    local_40 = sVar7;
    do {
      __src = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + mset->num_dimensions * sVar6;
      ::std::vector<int,_std::allocator<int>_>::vector(&local_70,__n,&local_79);
      if (__n != 0) {
        memmove(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,__src,local_48);
        lVar8 = local_78->stride * sVar6;
        piVar2 = (local_78->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar5 = 0;
        local_38 = sVar6;
        do {
          iVar4 = local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar5];
          if (iVar4 == 0) {
            piVar2[lVar8 + sVar5] = -1;
          }
          else {
            local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[sVar5] = ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) - (uint)(iVar4 < 4);
            iVar4 = MultiIndexSet::getSlot
                              (mset,local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            piVar2[lVar8 + sVar5] = iVar4;
            if (iVar4 == -1) {
              bVar3 = true;
            }
            while( true ) {
              piVar1 = local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + sVar5;
              iVar4 = *piVar1;
              if ((iVar4 == 0) || (piVar2[lVar8 + sVar5] != -1)) break;
              *piVar1 = ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) - (uint)(iVar4 < 4);
              iVar4 = MultiIndexSet::getSlot
                                (mset,local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
              piVar2[lVar8 + sVar5] = iVar4;
            }
            *piVar1 = __src[sVar5];
          }
          sVar5 = sVar5 + 1;
          sVar6 = local_38;
        } while (sVar5 != __n);
      }
      local_38 = sVar6;
      if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      sVar6 = local_38 + 1;
    } while (sVar6 != local_40);
    bVar3 = !bVar3;
  }
  *local_50 = bVar3;
  return local_78;
}

Assistant:

Data2D<int> computeDAGup(MultiIndexSet const &mset, bool &is_complete){
    size_t num_dimensions = mset.getNumDimensions();
    int num_points = mset.getNumIndexes();
    if (RuleLocal::getMaxNumParents<effrule>() > 1){ // allow for multiple parents and level 0 may have more than one node
        int max_parents = RuleLocal::getMaxNumParents<effrule>() * (int) num_dimensions;
        Data2D<int> parents(max_parents, num_points, -1);
        int level0_offset = RuleLocal::getNumPoints<effrule>(0);
        int any_fail = 0; // count if there are failures
        #pragma omp parallel
        {
            int fail = 0; // local thread count fails

            #pragma omp for schedule(static)
            for(int i=0; i<num_points; i++){
                const int *p = mset.getIndex(i);
                std::vector<int> dad(num_dimensions);
                std::copy_n(p, num_dimensions, dad.data());
                int *pp = parents.getStrip(i);
                for(size_t j=0; j<num_dimensions; j++){
                    if (dad[j] >= level0_offset){
                        int current = p[j];
                        dad[j] = RuleLocal::getParent<effrule>(current);
                        pp[2*j] = mset.getSlot(dad);
                        if (pp[2*j] == -1)
                            fail = 1;
                        while ((dad[j] >= level0_offset) && (pp[2*j] == -1)){
                            current = dad[j];
                            dad[j] = RuleLocal::getParent<effrule>(current);
                            pp[2*j] = mset.getSlot(dad);
                        }
                        dad[j] = RuleLocal::getStepParent<effrule>(current);
                        if (dad[j] != -1){
                            pp[2*j + 1] = mset.getSlot(dad);
                            if (pp[2*j + 1] == -1)
                                fail = 1;
                        }
                        dad[j] = p[j];
                    }
                }
            }

            #pragma omp atomic
            any_fail += fail;
        }
        is_complete = (any_fail == 0);
        return parents;
    }else{ // this assumes that level zero has only one node
        Data2D<int> parents((int) num_dimensions, num_points);
        int any_fail = 0; // count if there are failures
        #pragma omp parallel
        {
            int fail = 0; // local thread count fails

            #pragma omp for schedule(static)
            for(int i=0; i<num_points; i++){
                const int *p = mset.getIndex(i);
                std::vector<int> dad(num_dimensions);
                std::copy_n(p, num_dimensions, dad.data());
                int *pp = parents.getStrip(i);
                for(size_t j=0; j<num_dimensions; j++){
                    if (dad[j] == 0){
                        pp[j] = -1;
                    }else{
                        dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                        pp[j] = mset.getSlot(dad.data());
                        if (pp[j] == -1)
                            fail = 1;
                        while((dad[j] != 0) && (pp[j] == -1)){
                            dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                            pp[j] = mset.getSlot(dad);
                        }
                        dad[j] = p[j];
                    }
                }
            }

            #pragma omp atomic
            any_fail += fail;
        }
        is_complete = (any_fail == 0);
        return parents;
    }
}